

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O2

int __thiscall Fl_Check_Browser::lineno(Fl_Check_Browser *this,cb_item *p0)

{
  int iVar1;
  cb_item *pcVar2;
  int iVar3;
  
  pcVar2 = this->first;
  iVar1 = 0;
  if (pcVar2 != (cb_item *)0x0) {
    iVar3 = 1;
    for (; (iVar1 = 0, pcVar2 != (cb_item *)0x0 && (iVar1 = iVar3, pcVar2 != p0));
        pcVar2 = pcVar2->next) {
      iVar3 = iVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

int Fl_Check_Browser::lineno(cb_item *p0) const {
	cb_item *p = first;

	if (p == 0) {
		return 0;
	}

	int i = 1;
	while (p) {
		if (p == p0) {
			return i;
		}
		i++;
		p = p->next;
	}

	return 0;
}